

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
bulk_load(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
          *this,V *values,int num_keys,LinearModel<int> *pretrained_model,bool train_with_sample)

{
  int *piVar1;
  double *pdVar2;
  undefined8 *in_RCX;
  int in_EDX;
  undefined4 *in_RSI;
  long in_RDI;
  byte in_R8B;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *unaff_retaddr;
  bool in_stack_0000000f;
  LinearModel<int> *in_stack_00000010;
  int in_stack_0000001c;
  V *in_stack_00000020;
  int i_2;
  int j_2;
  int j_1;
  int j;
  int pos;
  int positions_remaining;
  int position;
  int i_1;
  int keys_remaining;
  int last_position;
  int i;
  double local_70;
  double in_stack_ffffffffffffff98;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_ffffffffffffffa0;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  byte local_21;
  undefined8 *local_20;
  int local_14;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_14 = in_EDX;
  initialize(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(double)in_RSI);
  if (local_14 == 0) {
    *(double *)(in_RDI + 0x70) = (double)*(int *)(in_RDI + 0x58);
    *(undefined8 *)(in_RDI + 0x78) = 0;
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x58); local_28 = local_28 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_28 * 4) = 0x7fffffff;
    }
    return;
  }
  if (local_20 == (undefined8 *)0x0) {
    build_model(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000f);
  }
  else {
    *(undefined8 *)(in_RDI + 0x10) = *local_20;
    *(undefined8 *)(in_RDI + 0x18) = local_20[1];
  }
  LinearModel<int>::expand
            ((LinearModel<int> *)(in_RDI + 0x10),(double)*(int *)(in_RDI + 0x58) / (double)local_14)
  ;
  local_2c = -1;
  local_30 = local_14;
  local_34 = 0;
  while( true ) {
    local_54 = local_2c;
    if (local_14 <= local_34) goto LAB_00170225;
    local_38 = LinearModel<int>::predict
                         ((LinearModel<int> *)(in_RDI + 0x10),in_RSI[(long)local_34 * 2]);
    local_3c = local_2c + 1;
    piVar1 = std::max<int>(&local_38,&local_3c);
    local_38 = *piVar1;
    local_50 = local_2c;
    if (*(int *)(in_RDI + 0x58) - local_38 < local_30) break;
    while (local_50 = local_50 + 1, local_50 < local_38) {
      *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_50 * 4) = in_RSI[(long)local_34 * 2];
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_38 * 4) = in_RSI[(long)local_34 * 2];
    *(undefined4 *)(*(long *)(in_RDI + 0x50) + (long)local_38 * 4) = in_RSI[(long)local_34 * 2 + 1];
    set_bit(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_2c = local_38;
    local_30 = local_30 + -1;
    local_34 = local_34 + 1;
  }
  local_44 = *(int *)(in_RDI + 0x58) - local_30;
  local_48 = local_2c;
  while (local_48 = local_48 + 1, local_48 < local_44) {
    *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_48 * 4) = in_RSI[(long)local_34 * 2];
  }
  for (local_4c = local_34; local_4c < local_14; local_4c = local_4c + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_44 * 4) = in_RSI[(long)local_4c * 2];
    *(undefined4 *)(*(long *)(in_RDI + 0x50) + (long)local_44 * 4) = in_RSI[(long)local_4c * 2 + 1];
    set_bit(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_44 = local_44 + 1;
  }
  local_54 = local_44 + -1;
  local_2c = local_54;
LAB_00170225:
  while (local_54 = local_54 + 1, local_54 < *(int *)(in_RDI + 0x58)) {
    *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_54 * 4) = 0x7fffffff;
  }
  pdVar2 = std::max<double>((double *)&stack0xffffffffffffffa0,(double *)&stack0xffffffffffffff98);
  local_70 = (double)*(int *)(in_RDI + 0x58);
  pdVar2 = std::min<double>(pdVar2,&local_70);
  *(double *)(in_RDI + 0x70) = *pdVar2;
  *(double *)(in_RDI + 0x78) = (double)*(int *)(in_RDI + 0x58) * 0.6;
  *(undefined4 *)(in_RDI + 0xa8) = *in_RSI;
  *(undefined4 *)(in_RDI + 0xa4) = in_RSI[(long)(local_14 + -1) * 2];
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys,
                 const LinearModel<T>* pretrained_model = nullptr,
                 bool train_with_sample = false) {
    initialize(num_keys, kInitDensity_);

    if (num_keys == 0) {
      expansion_threshold_ = data_capacity_;
      contraction_threshold_ = 0;
      for (int i = 0; i < data_capacity_; i++) {
        ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
      }
      return;
    }

    // Build model
    if (pretrained_model != nullptr) {
      this->model_.a_ = pretrained_model->a_;
      this->model_.b_ = pretrained_model->b_;
    } else {
      build_model(values, num_keys, &(this->model_), train_with_sample);
    }
    this->model_.expand(static_cast<double>(data_capacity_) / num_keys);

    // Model-based inserts
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int position = this->model_.predict(values[i].first);
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = data_capacity_ - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = data_capacity_ - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
          ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
        }
        for (int j = i; j < num_keys; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          key_slots_[pos] = values[j].first;
          payload_slots_[pos] = values[j].second;
#else
          data_slots_[pos] = values[j];
#endif
          set_bit(pos);
          pos++;
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
        ALEX_DATA_NODE_KEY_AT(j) = values[i].first;
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      key_slots_[position] = values[i].first;
      payload_slots_[position] = values[i].second;
#else
      data_slots_[position] = values[i];
#endif
      set_bit(position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < data_capacity_; i++) {
      ALEX_DATA_NODE_KEY_AT(i) = kEndSentinel_;
    }

    expansion_threshold_ = std::min(std::max(data_capacity_ * kMaxDensity_,
                                             static_cast<double>(num_keys + 1)),
                                    static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
    min_key_ = values[0].first;
    max_key_ = values[num_keys - 1].first;
  }